

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

uint32_t upb_Arena_DebugRefCount(upb_Arena *a)

{
  upb_ArenaRoot uVar1;
  
  uVar1 = _upb_Arena_FindRoot((upb_ArenaInternal *)(a + 1));
  if (((undefined1  [16])uVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return (uint32_t)(uVar1.tagged_count >> 1);
  }
  __assert_fail("_upb_Arena_IsTaggedRefcount(parent_or_count)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena.c"
                ,0x70,"uintptr_t _upb_Arena_RefCountFromTagged(uintptr_t)");
}

Assistant:

uint32_t upb_Arena_DebugRefCount(const upb_Arena* a) {
  uintptr_t tagged = _upb_Arena_FindRoot(upb_Arena_Internal(a)).tagged_count;
  return (uint32_t)_upb_Arena_RefCountFromTagged(tagged);
}